

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBase::Swap(MapFieldBase *this,MapFieldBase *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  UntypedMapBase *this_00;
  UntypedMapBase *other_00;
  MapFieldBase *other_local;
  MapFieldBase *this_local;
  
  pAVar1 = arena(this);
  pAVar2 = arena(other);
  if (pAVar1 == pAVar2) {
    InternalSwap(this,other);
  }
  else {
    SwapPayload(this,other);
    this_00 = MapFieldBaseForParse::GetMapRaw(&this->super_MapFieldBaseForParse);
    other_00 = MapFieldBaseForParse::GetMapRaw(&other->super_MapFieldBaseForParse);
    UntypedMapBase::UntypedSwap(this_00,other_00);
  }
  return;
}

Assistant:

void MapFieldBase::Swap(MapFieldBase* other) {
  if (arena() == other->arena()) {
    InternalSwap(other);
    return;
  }
  MapFieldBase::SwapPayload(*this, *other);
  GetMapRaw().UntypedSwap(other->GetMapRaw());
}